

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCountTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::TextureCountTests::init(TextureCountTests *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  deUint32 dataType;
  int numTextures;
  Context *context;
  long *plVar2;
  undefined8 *puVar3;
  char *__s;
  Texture2DRenderCase *this_00;
  ostringstream *poVar4;
  size_type *psVar5;
  undefined1 (*pauVar6) [16];
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  int row;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  bool bVar15;
  undefined4 uVar16;
  allocator<char> local_255;
  deUint32 local_254;
  string description;
  string name;
  long *local_210 [2];
  long local_200 [2];
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  TestNode *local_1d0;
  long local_1c8;
  char *local_1c0;
  int local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined4 local_188;
  ios_base local_138 [264];
  long lVar14;
  
  paVar1 = &description.field_2;
  local_1c8 = 0;
  local_1b8 = -0x80000000;
  uStack_1b4 = 0x80000000;
  uStack_1b0 = 0x80000000;
  uStack_1ac = 0x80000000;
  local_1d0 = (TestNode *)this;
  do {
    local_254 = init::texFormats[local_1c8].format;
    dataType = init::texFormats[local_1c8].dataType;
    local_1c0 = init::texFormats[local_1c8].name;
    lVar12 = 0;
    do {
      numTextures = addShaderCompilationPerformanceCases(deqp::gles2::TestCaseGroup&)::
                    texLookupCounts[lVar12];
      std::__cxx11::string::string<std::allocator<char>>((string *)local_210,local_1c0,&local_255);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_210);
      psVar5 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar5) {
        description.field_2._M_allocated_capacity = *psVar5;
        description.field_2._8_8_ = plVar2[3];
        description._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        description.field_2._M_allocated_capacity = *psVar5;
        description._M_dataplus._M_p = (pointer)*plVar2;
      }
      description._M_string_length = plVar2[1];
      *plVar2 = (long)psVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<((ostringstream *)local_1a8,numTextures);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        uVar7 = description.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_1e8 + description._M_string_length) {
        uVar8 = 0xf;
        if (local_1f0 != local_1e0) {
          uVar8 = local_1e0[0];
        }
        if (uVar8 < local_1e8 + description._M_string_length) goto LAB_00402ddb;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1f0,0,(char *)0x0,(ulong)description._M_dataplus._M_p);
      }
      else {
LAB_00402ddb:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&description,(ulong)local_1f0);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar5 = puVar3 + 2;
      if ((size_type *)*puVar3 == psVar5) {
        name.field_2._M_allocated_capacity = *psVar5;
        name.field_2._8_8_ = puVar3[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar5;
        name._M_dataplus._M_p = (pointer)*puVar3;
      }
      name._M_string_length = puVar3[1];
      *puVar3 = psVar5;
      puVar3[1] = 0;
      *(char *)psVar5 = '\0';
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if (local_210[0] != local_200) {
        operator_delete(local_210[0],local_200[0] + 1);
      }
      __s = glu::getTextureFormatName(local_254);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_210,__s,(allocator<char> *)&local_1f0);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_210);
      local_1a8._0_8_ = local_198;
      pauVar6 = (undefined1 (*) [16])(plVar2 + 2);
      if ((undefined1 (*) [16])*plVar2 == pauVar6) {
        local_198 = *pauVar6;
      }
      else {
        local_198._0_8_ = *(long *)*pauVar6;
        local_1a8._0_8_ = (undefined1 (*) [16])*plVar2;
      }
      local_1a8._8_8_ = plVar2[1];
      *plVar2 = (long)pauVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      glu::getTypeName(dataType);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_1a8);
      psVar5 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar5) {
        description.field_2._M_allocated_capacity = *psVar5;
        description.field_2._8_8_ = plVar2[3];
        description._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        description.field_2._M_allocated_capacity = *psVar5;
        description._M_dataplus._M_p = (pointer)*plVar2;
      }
      description._M_string_length = plVar2[1];
      *plVar2 = (long)psVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((undefined1 *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
      }
      if (local_210[0] != local_200) {
        operator_delete(local_210[0],local_200[0] + 1);
      }
      this_00 = (Texture2DRenderCase *)operator_new(0x220);
      context = (Context *)local_1d0[1]._vptr_TestNode;
      local_198 = (undefined1  [16])0x0;
      local_1a8 = (undefined1  [16])0x0;
      local_188 = 0;
      lVar9 = 0;
      lVar10 = 0;
      poVar4 = (ostringstream *)local_1a8;
      do {
        lVar11 = 0;
        auVar13 = _DAT_00632fe0;
        do {
          bVar15 = SUB164(auVar13 ^ _DAT_00625ae0,4) == local_1b8 &&
                   SUB164(auVar13 ^ _DAT_00625ae0,0) < -0x7ffffffd;
          if (bVar15) {
            uVar16 = 0x3f800000;
            if (lVar9 != lVar11) {
              uVar16 = 0;
            }
            *(undefined4 *)(poVar4 + lVar11) = uVar16;
          }
          if (bVar15) {
            uVar16 = 0x3f800000;
            if (lVar9 + -0xc != lVar11) {
              uVar16 = 0;
            }
            *(undefined4 *)(poVar4 + lVar11 + 0xc) = uVar16;
          }
          lVar14 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar14 + 2;
          lVar11 = lVar11 + 0x18;
        } while (lVar11 != 0x30);
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0xc;
        poVar4 = poVar4 + 4;
      } while (lVar10 != 3);
      Texture2DRenderCase::Texture2DRenderCase
                (this_00,context,name._M_dataplus._M_p,description._M_dataplus._M_p,local_254,
                 dataType,0x812f,0x812f,0x2600,0x2600,(Mat3 *)local_1a8,numTextures,false);
      tcu::TestNode::addChild(local_1d0,(TestNode *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    local_1c8 = local_1c8 + 1;
    if (local_1c8 == 4) {
      return 4;
    }
  } while( true );
}

Assistant:

void TextureCountTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};
	static const int texCounts[] = { 1, 2, 4, 8 };

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		for (int cntNdx = 0; cntNdx < DE_LENGTH_OF_ARRAY(texCounts); cntNdx++)
		{
			deUint32	format			= texFormats[formatNdx].format;
			deUint32	dataType		= texFormats[formatNdx].dataType;
			deUint32	wrapS			= GL_CLAMP_TO_EDGE;
			deUint32	wrapT			= GL_CLAMP_TO_EDGE;
			deUint32	minFilter		= GL_NEAREST;
			deUint32	magFilter		= GL_NEAREST;
			int			numTextures		= texCounts[cntNdx];
			string		name			= string(texFormats[formatNdx].name) + "_" + de::toString(numTextures);
			string		description		= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

			addChild(new Texture2DRenderCase(m_context, name.c_str(), description.c_str(), format, dataType, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
		}
	}
}